

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdfjob-c.cc
# Opt level: O0

int qpdfjob_initialize_from_wide_argv(qpdfjob_handle j,wchar_t **argv)

{
  int iVar1;
  anon_class_8_1_54a3980a local_50;
  function<int_(int,_const_char_*const_*)> local_48;
  wchar_t **local_28;
  wchar_t **k;
  wchar_t **ppwStack_18;
  int argc;
  wchar_t **argv_local;
  qpdfjob_handle j_local;
  
  k._4_4_ = 0;
  for (local_28 = argv; iVar1 = k._4_4_, *local_28 != (wchar_t *)0x0; local_28 = local_28 + 1) {
    k._4_4_ = k._4_4_ + 1;
  }
  local_50.j = j;
  ppwStack_18 = argv;
  argv_local = (wchar_t **)j;
  std::function<int(int,char_const*const*)>::function<qpdfjob_initialize_from_wide_argv::__0,void>
            ((function<int(int,char_const*const*)> *)&local_48,&local_50);
  iVar1 = QUtil::call_main_from_wmain(iVar1,argv,&local_48);
  std::function<int_(int,_const_char_*const_*)>::~function(&local_48);
  return iVar1;
}

Assistant:

int
qpdfjob_initialize_from_wide_argv(qpdfjob_handle j, wchar_t const* const argv[])
{
    int argc = 0;
    for (auto k = argv; *k; ++k) {
        ++argc;
    }
    return QUtil::call_main_from_wmain(argc, argv, [j](int, char const* const new_argv[]) {
        return qpdfjob_initialize_from_argv(j, new_argv);
    });
}